

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_debug.c
# Opt level: O1

uint64_t debug_get_flags_option(char *name,debug_named_value *flags,uint64_t dfault)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  char *pcVar8;
  debug_named_value *pdVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  char *__s1;
  ulong uVar13;
  
  pcVar4 = os_get_option(name);
  if (pcVar4 != (char *)0x0) {
    iVar3 = strcmp(pcVar4,"help");
    if (iVar3 == 0) {
      uVar13 = 0;
      _debug_printf("%s: help for %s:\n","debug_get_flags_option",name);
      pcVar4 = flags->name;
      if (pcVar4 != (char *)0x0) {
        pdVar9 = flags + 1;
        uVar12 = 0;
        do {
          sVar5 = strlen(pcVar4);
          uVar13 = sVar5 & 0xffffffff;
          if (sVar5 < uVar12) {
            uVar13 = (ulong)uVar12;
          }
          pcVar4 = pdVar9->name;
          pdVar9 = pdVar9 + 1;
          uVar12 = (uint)uVar13;
        } while (pcVar4 != (char *)0x0);
      }
      pcVar4 = flags->name;
      if (pcVar4 != (char *)0x0) {
        pdVar9 = flags + 1;
        do {
          pcVar7 = pdVar9[-1].desc;
          pcVar10 = " ";
          if (pcVar7 == (char *)0x0) {
            pcVar10 = "";
            pcVar7 = "";
          }
          _debug_printf("| %*s [0x%0*lx]%s%s\n",uVar13,pcVar4,0x10,pdVar9[-1].value,pcVar10,pcVar7);
          pcVar4 = pdVar9->name;
          pdVar9 = pdVar9 + 1;
        } while (pcVar4 != (char *)0x0);
      }
    }
    else {
      pcVar7 = flags->name;
      if (pcVar7 != (char *)0x0) {
        cVar1 = *pcVar4;
        dfault = 0;
LAB_001fceb4:
        if (cVar1 != '\0') {
          iVar3 = strcmp(pcVar4,"all");
          if (iVar3 != 0) {
            sVar5 = strlen(pcVar7);
            pcVar11 = pcVar4 + -(sVar5 & 0xffffffff);
            __s1 = pcVar4;
            pcVar10 = pcVar4;
            do {
              pcVar8 = pcVar10 + 1;
              cVar2 = *pcVar10;
              if (((long)cVar2 == 0) ||
                 ((ppuVar6 = __ctype_b_loc(), cVar2 != '_' && (((*ppuVar6)[cVar2] & 8) == 0)))) {
                if (__s1 == pcVar11) {
                  iVar3 = bcmp(__s1,pcVar7,sVar5 & 0xffffffff);
                  if ((cVar2 == '\0') || (__s1 = pcVar8, iVar3 == 0)) goto LAB_001fcf46;
                }
                else {
                  __s1 = pcVar8;
                  if (cVar2 == '\0') goto LAB_001fcf78;
                }
              }
              pcVar11 = pcVar11 + 1;
              pcVar10 = pcVar8;
            } while( true );
          }
          goto LAB_001fcf5e;
        }
        goto LAB_001fcf78;
      }
      dfault = 0;
    }
  }
LAB_001fd044:
  if (debug_get_option_should_print_first == '\0') {
    debug_get_option_should_print_first = '\x01';
    debug_get_bool_option("GALLIUM_PRINT_OPTIONS",false);
  }
  return dfault;
LAB_001fcf46:
  if (iVar3 == 0) {
LAB_001fcf5e:
    dfault = dfault | flags->value;
  }
LAB_001fcf78:
  pcVar7 = flags[1].name;
  flags = flags + 1;
  if (pcVar7 == (char *)0x0) goto LAB_001fd044;
  goto LAB_001fceb4;
}

Assistant:

uint64_t
debug_get_flags_option(const char *name,
                       const struct debug_named_value *flags,
                       uint64_t dfault)
{
   uint64_t result;
   const char *str;
   const struct debug_named_value *orig = flags;
   unsigned namealign = 0;

   str = os_get_option(name);
   if (!str)
      result = dfault;
   else if (!strcmp(str, "help")) {
      result = dfault;
      _debug_printf("%s: help for %s:\n", __FUNCTION__, name);
      for (; flags->name; ++flags)
         namealign = MAX2(namealign, strlen(flags->name));
      for (flags = orig; flags->name; ++flags)
         _debug_printf("| %*s [0x%0*"PRIx64"]%s%s\n", namealign, flags->name,
                      (int)sizeof(uint64_t)*CHAR_BIT/4, flags->value,
                      flags->desc ? " " : "", flags->desc ? flags->desc : "");
   }
   else {
      result = 0;
      while (flags->name) {
	 if (str_has_option(str, flags->name))
	    result |= flags->value;
	 ++flags;
      }
   }

   if (debug_get_option_should_print()) {
      if (str) {
         debug_printf("%s: %s = 0x%"PRIx64" (%s)\n",
                      __FUNCTION__, name, result, str);
      } else {
         debug_printf("%s: %s = 0x%"PRIx64"\n", __FUNCTION__, name, result);
      }
   }

   return result;
}